

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidTrim(ON_Brep *this,int trim_index,ON_TextLog *text_log)

{
  int *piVar1;
  ON_3dPoint *pOVar2;
  ON_BrepTrim *this_00;
  double dVar3;
  double dVar4;
  uint uVar5;
  TYPE TVar6;
  uint uVar7;
  int iVar8;
  ON_BrepTrim *pOVar9;
  ON_Curve *pOVar10;
  ON_BrepEdge *pOVar11;
  int *piVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  ON_Curve *pOVar19;
  double *pdVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  double dVar28;
  ON_Interval c2_domain;
  ON_Interval trim_domain;
  ulong local_88;
  int *local_80;
  uint local_74;
  ON_Interval local_58;
  ON_Interval local_48;
  ON_BrepLoop *local_38;
  
  uVar22 = (ulong)(uint)trim_index;
  if ((trim_index < 0) ||
     ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count <=
      trim_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                        uVar22,(ulong)(uint)(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                            super_ON_ClassArray<ON_BrepTrim>.m_count);
    }
    goto LAB_003ef350;
  }
  pOVar9 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
  this_00 = pOVar9 + uVar22;
  if (pOVar9[uVar22].m_trim_index != trim_index) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef350;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    uVar18 = this_00->m_trim_index;
    pcVar26 = "trim.m_trim_index = %d (should be %d).\n";
LAB_003ef2ea:
    ON_TextLog::Print(text_log,pcVar26,(ulong)uVar18,uVar22);
LAB_003ef348:
    ON_TextLog::PopIndent(text_log);
LAB_003ef350:
    bVar13 = ON_IsNotValid();
    return bVar13;
  }
  iVar17 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
             _vptr_ON_Object[6])(this_00,text_log);
  if ((char)iVar17 == '\0') {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    }
    goto LAB_003ef350;
  }
  iVar17 = this_00->m_c2i;
  if (((long)iVar17 < 0) || ((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count <= iVar17)) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef350;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    uVar5 = this_00->m_c2i;
    uVar18 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count;
    pcVar26 = "trim.m_c2i = %d (should be >=0 and <%d).\n";
    uVar22 = 0;
LAB_003ef341:
    ON_TextLog::Print(text_log,pcVar26,(ulong)uVar5,uVar22,(ulong)uVar18);
    goto LAB_003ef348;
  }
  pOVar10 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[iVar17];
  if (pOVar10 == (ON_Curve *)0x0) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef350;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    uVar18 = this_00->m_c2i;
    uVar22 = (ulong)uVar18;
    pcVar26 = "trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n";
    goto LAB_003ef2ea;
  }
  uVar18 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pOVar10);
  if (uVar18 != 2) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef350;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    uVar5 = this_00->m_c2i;
    uVar22 = (ulong)uVar5;
    pcVar26 = "trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n";
    goto LAB_003ef341;
  }
  pOVar19 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
  if (pOVar10 != pOVar19) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef350;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
    goto LAB_003ef348;
  }
  (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(this_00);
  (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar10);
  bVar13 = ON_Interval::IsIncreasing(&local_48);
  if (!bVar13) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef62d;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    pdVar20 = ON_Interval::operator[](&local_48,0);
    dVar28 = *pdVar20;
    pdVar20 = ON_Interval::operator[](&local_48,1);
    ON_TextLog::Print(text_log,"trim.Domain() = (%g,%g) (should be an increasing interval).\n",
                      dVar28,*pdVar20);
    goto LAB_003ef625;
  }
  bVar13 = ON_Interval::Includes(&local_58,&local_48,false);
  if (!bVar13) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pdVar20 = ON_Interval::operator[](&local_48,0);
      dVar28 = *pdVar20;
      pdVar20 = ON_Interval::operator[](&local_48,1);
      dVar3 = *pdVar20;
      uVar18 = this_00->m_c2i;
      pdVar20 = ON_Interval::operator[](&local_58,0);
      dVar4 = *pdVar20;
      pdVar20 = ON_Interval::operator[](&local_58,1);
      ON_TextLog::Print(text_log,
                        "trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n"
                        ,dVar28,dVar3,dVar4,*pdVar20,(ulong)uVar18);
      goto LAB_003ef625;
    }
    goto LAB_003ef62d;
  }
  uVar18 = this_00->m_vi[0];
  uVar24 = (ulong)uVar18;
  if (((int)uVar18 < 0) ||
     (iVar17 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_count, iVar17 <= (int)uVar18)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_count;
      pcVar26 = "trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n";
LAB_003ef61e:
      ON_TextLog::Print(text_log,pcVar26,uVar22,uVar24,(ulong)uVar18);
      goto LAB_003ef625;
    }
    goto LAB_003ef62d;
  }
  uVar5 = this_00->m_vi[1];
  if ((int)uVar5 < 0 || iVar17 <= (int)uVar5) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar18 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_count;
      pcVar26 = "trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n";
      uVar24 = (ulong)uVar5;
      goto LAB_003ef61e;
    }
    goto LAB_003ef62d;
  }
  piVar1 = &this_00->m_ei;
  TVar6 = this_00->m_type;
  uVar21 = (ulong)TVar6;
  local_88 = 0xffffffff;
  if (TVar6 != ptonsrf) {
    uVar7 = this_00->m_ei;
    uVar23 = (ulong)uVar7;
    if (TVar6 != singular) {
      if ((-1 < (int)uVar7) &&
         ((int)uVar7 <
          (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)) {
        pOVar11 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
        ;
        if (pOVar11[uVar23].m_vi[this_00->m_bRev3d] == uVar18) {
          if (pOVar11[uVar23].m_vi[this_00->m_bRev3d ^ 1] != uVar5) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
              ON_TextLog::PushIndent(text_log);
              pcVar26 = "trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n";
              goto LAB_003ef98f;
            }
LAB_003ef9b0:
            local_88 = 0xffffffff;
            goto LAB_003ef9b8;
          }
          bVar13 = ON_Interval::operator==(&local_48,&local_58);
          if (((bVar13) &&
              (iVar17 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])
                                  (pOVar10), (char)iVar17 != '\0')) && (uVar18 != uVar5)) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ef9b0;
            ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n"
                              ,(ulong)uVar18,uVar5,(ulong)(uint)this_00->m_c2i);
            goto LAB_003ef99e;
          }
          iVar17 = pOVar11[uVar23].m_ti.m_count;
          uVar21 = (ulong)iVar17;
          local_88 = 0xffffffff;
          if (0 < (long)uVar21) {
            uVar24 = 0;
            do {
              if (pOVar11[uVar23].m_ti.m_a[uVar24] == trim_index) {
                local_88 = uVar24 & 0xffffffff;
                break;
              }
              uVar24 = uVar24 + 1;
            } while (uVar21 != uVar24);
          }
          if ((int)local_88 < 0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
              ON_TextLog::PushIndent(text_log);
              uVar18 = *piVar1;
              pcVar26 = "trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n";
              uVar24 = uVar22;
LAB_003efd6d:
              ON_TextLog::Print(text_log,pcVar26,uVar24,(ulong)uVar18);
              goto LAB_003ef9a6;
            }
            goto LAB_003ef9b8;
          }
          bVar13 = true;
          if (iVar17 == 2) {
            piVar12 = pOVar11[uVar23].m_ti.m_a;
            iVar17 = piVar12[*piVar12 == trim_index];
            uVar21 = (ulong)iVar17;
            if (((-1 < (long)uVar21) && (iVar17 != trim_index)) &&
               ((iVar17 < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_count &&
                ((uVar18 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_a[uVar21].m_li, uVar21 = (ulong)uVar18
                 , uVar18 == this_00->m_li && (this_00->m_type != seam)))))) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
                ON_TextLog::PushIndent(text_log);
                uVar18 = this_00->m_li;
                pcVar26 = 
                "trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n"
                ;
                uVar24 = (ulong)(uint)this_00->m_ei;
                goto LAB_003efd6d;
              }
              goto LAB_003ef9b8;
            }
          }
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_003ef9b0;
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
          ON_TextLog::PushIndent(text_log);
          pcVar26 = "trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n";
LAB_003ef98f:
          ON_TextLog::Print(text_log,pcVar26,uVar23);
LAB_003ef99e:
          local_88 = 0xffffffff;
LAB_003ef9a6:
          ON_TextLog::PopIndent(text_log);
LAB_003ef9b8:
          bVar13 = false;
          bVar15 = ON_IsNotValid();
          uVar21 = (ulong)bVar15;
        }
        bVar14 = (byte)uVar21;
        if (!bVar13) goto LAB_003ef632;
        goto LAB_003ef679;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ef62d;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar18 = *piVar1;
      uVar5 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count
      ;
      pcVar26 = 
      "trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n";
LAB_003ef849:
      uVar24 = (ulong)uVar18;
      uVar22 = (ulong)uVar5;
LAB_003ef84c:
      ON_TextLog::Print(text_log,pcVar26,uVar24,uVar22);
      goto LAB_003ef625;
    }
    if (uVar7 != 0xffffffff) {
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ef62d;
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pcVar26 = "trim.m_type = singular but trim.m_ei = %d (should be -1)\n";
LAB_003ef6f1:
      ON_TextLog::Print(text_log,pcVar26,uVar23);
      goto LAB_003ef625;
    }
    if (uVar18 == uVar5) {
      uVar18 = (*(pOVar10->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar10);
      uVar21 = (ulong)uVar18;
      if ((char)uVar18 == '\0') goto LAB_003ef679;
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
        ON_TextLog::PushIndent(text_log);
        uVar22 = (ulong)(uint)this_00->m_c2i;
        pcVar26 = "trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n";
        uVar24 = (ulong)(uint)this_00->m_c2i;
        goto LAB_003ef84c;
      }
    }
    else if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pcVar26 = 
      "trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n";
      uVar22 = (ulong)uVar5;
      goto LAB_003ef84c;
    }
    goto LAB_003ef62d;
  }
LAB_003ef679:
  bVar14 = (byte)uVar21;
  local_80 = &this_00->m_li;
  lVar27 = (long)this_00->m_li;
  if ((lVar27 < 0) ||
     ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      this_00->m_li)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar18 = *local_80;
      uVar5 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
      ;
      pcVar26 = "trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n";
      goto LAB_003ef849;
    }
    goto LAB_003ef62d;
  }
  iVar17 = *piVar1;
  if (((int)local_88 < 0) && (-1 < iVar17)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar23 = (ulong)(uint)*piVar1;
      pcVar26 = "brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n";
      goto LAB_003ef6f1;
    }
    goto LAB_003ef62d;
  }
  if (trim_type_count < this_00->m_type) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pcVar26 = "trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n";
      goto LAB_003f00e7;
    }
    goto LAB_003ef62d;
  }
  switch(this_00->m_type) {
  case unknown:
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ef62d;
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    pcVar26 = "trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n";
    goto LAB_003f00e7;
  case boundary:
    if ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a[iVar17].
        m_ti.m_count < 2) {
      bVar13 = true;
      if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar27]
          .m_type - outer < 2) goto LAB_003effe2;
      if (text_log != (ON_TextLog *)0x0) {
        pcVar26 = 
        "trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n";
        goto LAB_003effa3;
      }
    }
    else if (text_log != (ON_TextLog *)0x0) {
      pcVar26 = "trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n";
      local_80 = piVar1;
LAB_003effa3:
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      uVar18 = *local_80;
LAB_003effcb:
      ON_TextLog::Print(text_log,pcVar26,(ulong)uVar18);
LAB_003effd2:
      ON_TextLog::PopIndent(text_log);
    }
    break;
  case mated:
    if ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a[iVar17].
        m_ti.m_count < 2) {
      if (text_log != (ON_TextLog *)0x0) {
        pcVar26 = "trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n";
        local_80 = piVar1;
        goto LAB_003effa3;
      }
    }
    else {
      bVar13 = true;
      if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar27]
          .m_type - outer < 2) goto LAB_003effe2;
      if (text_log != (ON_TextLog *)0x0) {
        pcVar26 = "trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n";
        goto LAB_003effa3;
      }
    }
    break;
  case seam:
    pOVar11 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    if (pOVar11[iVar17].m_ti.m_count < 2) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
        ON_TextLog::PushIndent(text_log);
        uVar18 = *piVar1;
        pcVar26 = "trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n";
        goto LAB_003effcb;
      }
      break;
    }
    local_38 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    iVar8 = pOVar11[iVar17].m_ti.m_count;
    bVar13 = 0 < iVar8;
    if (iVar8 < 1) {
      local_74._0_1_ = 1;
    }
    else {
      local_74 = 0xffffffff;
      uVar24 = 0;
      do {
        if (local_88 != uVar24) {
          uVar18 = pOVar11[iVar17].m_ti.m_a[uVar24];
          uVar23 = (ulong)uVar18;
          uVar5 = local_74;
          if (uVar18 == trim_index) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",(ulong)(uint)*piVar1);
              ON_TextLog::PushIndent(text_log);
              ON_TextLog::Print(text_log,"edge.m_ti[%d] = m_ti[%d] = %d.\n",local_88,
                                uVar24 & 0xffffffff,uVar22);
LAB_003eff2a:
              ON_TextLog::PopIndent(text_log);
            }
LAB_003eff32:
            bVar15 = false;
            bVar16 = ON_IsNotValid();
            uVar21 = (ulong)bVar16;
            uVar5 = local_74;
          }
          else {
            if (((int)uVar18 < 0) ||
               ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_count <= (int)uVar18)) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",(ulong)(uint)*piVar1)
                ;
                ON_TextLog::PushIndent(text_log);
                pcVar26 = "edge.m_ti[%d]=%d is not a valid m_T[] index.\n";
                uVar21 = uVar24 & 0xffffffff;
LAB_003eff23:
                ON_TextLog::Print(text_log,pcVar26,uVar21,uVar23);
                goto LAB_003eff2a;
              }
              goto LAB_003eff32;
            }
            pOVar9 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            bVar15 = true;
            if (((pOVar9[uVar23].m_type == seam) && (pOVar9[uVar23].m_li == *local_80)) &&
               (uVar5 = uVar18, -1 < (int)local_74)) {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"brep.m_T[%d,%d, or %d] trim is not valid.\n",uVar22,
                                  (ulong)local_74,uVar23);
                ON_TextLog::PushIndent(text_log);
                uVar21 = (ulong)(uint)*piVar1;
                uVar23 = (ulong)(uint)*local_80;
                pcVar26 = "All three trims have m_type = seam m_ei=%d and m_li = %d.\n";
                goto LAB_003eff23;
              }
              goto LAB_003eff32;
            }
          }
          local_74 = uVar5;
          bVar14 = (byte)uVar21;
          if (!bVar15) break;
        }
        bVar14 = (byte)uVar21;
        uVar24 = uVar24 + 1;
        lVar25 = (long)pOVar11[iVar17].m_ti.m_count;
        bVar13 = (long)uVar24 < lVar25;
      } while ((long)uVar24 < lVar25);
      local_74._0_1_ = (byte)(local_74 >> 0x1f);
    }
    if (!bVar13) {
      if ((byte)local_74 == 0) {
        bVar13 = true;
        if ((local_38[lVar27].m_type == outer) || (2 < pOVar11[iVar17].m_ti.m_count))
        goto LAB_003effe2;
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
          ON_TextLog::PushIndent(text_log);
          uVar18 = *local_80;
          pcVar26 = 
          "trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n"
          ;
          goto LAB_003effcb;
        }
      }
      else if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_type = seam but its other trim is not in the loop.\n");
        goto LAB_003effd2;
      }
      break;
    }
    bVar13 = false;
    goto LAB_003effe2;
  case singular:
    if (3 < this_00->m_iso - W_iso) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
        ON_TextLog::PushIndent(text_log);
        pcVar26 = "trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n";
        goto LAB_003f00e7;
      }
      goto LAB_003ef62d;
    }
    goto LAB_003effeb;
  case crvonsrf:
    if (((((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
           [lVar27].m_type == crvonsrf) && (-1 < this_00->m_c2i)) &&
        (this_00->m_c2i < (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count)) &&
       ((-1 < iVar17 &&
        (bVar13 = true,
        iVar17 < (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_count)))) goto LAB_003effe2;
    break;
  case ptonsrf:
    if ((((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a[lVar27]
          .m_type == ptonsrf) && (iVar17 == -1)) && (this_00->m_c2i == -1)) {
      dVar28 = (this_00->m_pbox).m_min.x;
      pOVar2 = &(this_00->m_pbox).m_max;
      if ((dVar28 == pOVar2->x) && (!NAN(dVar28) && !NAN(pOVar2->x))) {
        dVar3 = (this_00->m_pbox).m_min.y;
        pdVar20 = &(this_00->m_pbox).m_max.y;
        if ((dVar3 == *pdVar20) && (!NAN(dVar3) && !NAN(*pdVar20))) {
          dVar4 = (this_00->m_pbox).m_min.z;
          pdVar20 = &(this_00->m_pbox).m_max.z;
          if ((((dVar4 == *pdVar20) && (!NAN(dVar4) && !NAN(*pdVar20))) &&
              ((dVar28 != -1.23432101234321e+308 || (NAN(dVar28))))) &&
             ((dVar3 != -1.23432101234321e+308 || (NAN(dVar3))))) {
            bVar13 = true;
            if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_003effe2;
          }
        }
      }
    }
    break;
  case slit:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pcVar26 = 
      "trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n";
      goto LAB_003f00e7;
    }
    goto LAB_003ef62d;
  case trim_type_count:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      pcVar26 = "trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n";
      goto LAB_003f00e7;
    }
    goto LAB_003ef62d;
  }
  bVar13 = false;
  bVar14 = ON_IsNotValid();
LAB_003effe2:
  if (!bVar13) goto LAB_003ef632;
LAB_003effeb:
  if (0.0 < this_00->m_tolerance[0] || this_00->m_tolerance[0] == 0.0) {
    if (0.0 < this_00->m_tolerance[1] || this_00->m_tolerance[1] == 0.0) {
      bVar13 = ON_BoundingBox::IsValid(&this_00->m_pbox);
      if (bVar13) {
        if (this_00->m_brep == this) {
          bVar14 = 1;
          goto LAB_003ef632;
        }
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
          ON_TextLog::PushIndent(text_log);
          pcVar26 = "trim.m_brep does not point to parent brep.\n";
          goto LAB_003f00e7;
        }
      }
      else if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
        ON_TextLog::PushIndent(text_log);
        pcVar26 = "trim.m_pbox is not valid.\n";
LAB_003f00e7:
        ON_TextLog::Print(text_log,pcVar26);
        goto LAB_003ef625;
      }
    }
    else if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
      ON_TextLog::PushIndent(text_log);
      dVar28 = this_00->m_tolerance[1];
      pcVar26 = "trim.m_tolerance[1] = %g (should be >= 0.0)\n";
      goto LAB_003f0063;
    }
  }
  else if (text_log != (ON_TextLog *)0x0) {
    ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",uVar22);
    ON_TextLog::PushIndent(text_log);
    dVar28 = this_00->m_tolerance[0];
    pcVar26 = "trim.m_tolerance[0] = %g (should be >= 0.0)\n";
LAB_003f0063:
    ON_TextLog::Print(text_log,pcVar26,dVar28);
LAB_003ef625:
    ON_TextLog::PopIndent(text_log);
  }
LAB_003ef62d:
  bVar14 = ON_IsNotValid();
LAB_003ef632:
  return (bool)(bVar14 & 1);
}

Assistant:

bool
ON_Brep::IsValidTrim( int trim_index, ON_TextLog* text_log ) const
{
  if ( trim_index < 0 || trim_index >= m_T.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                      trim_index, m_T.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepTrim& trim = m_T[trim_index];
  if ( trim.m_trim_index != trim_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_trim_index = %d (should be %d).\n",
                       trim.m_trim_index, trim_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !trim.IsValid(text_log) )
  {
    if ( text_log )
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
    return ON_BrepIsNotValid();
  }
  if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print( "trim.m_c2i = %d (should be >=0 and <%d).\n", trim.m_c2i, 0, m_C2.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const ON_Curve* pC = m_C2[trim.m_c2i];
  if ( !pC )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n", trim.m_c2i, trim.m_c2i );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int c2_dim = pC->Dimension();
  if ( c2_dim != 2 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n", trim.m_c2i, trim.m_c2i, c2_dim );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( pC != trim.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  //if ( trim.ProxyCurveIsReversed() )
  //{
  //  if ( text_log )
  //  {
  //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
  //    text_log->PushIndent();
  //    text_log->Print("trim.ProxyCurveIsReversed() is true\n");
  //    text_log->PopIndent();
  //  }
  //  return ON_BrepIsNotValid();
  //}

  ON_Interval trim_domain = trim.Domain();
  ON_Interval c2_domain = pC->Domain();
  if ( !trim_domain.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) (should be an increasing interval).\n", trim_domain[0], trim_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !c2_domain.Includes(trim_domain) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n",
                      trim_domain[0], trim_domain[1], trim.m_c2i, c2_domain[0], c2_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int vi0 = trim.m_vi[0];
  int vi1 = trim.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const int ei = trim.m_ei;
  int trim_eti = -1;
  if ( trim.m_type == ON_BrepTrim::singular ) 
  {
    // singular trim - no edge and 3d v0 = 3d v1
    if ( ei != -1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_ei = %d (should be -1)\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( vi0 != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n",
                        vi0,vi1);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( pC->IsClosed() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n",
                        trim.m_c2i,trim.m_c2i);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }
  else if ( trim.m_type != ON_BrepTrim::ptonsrf )
  {
    // non-singular non-ptonsrf trim must have valid edge
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n",
                        trim.m_ei,m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( edge.m_vi[trim.m_bRev3d?1:0] != vi0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( edge.m_vi[trim.m_bRev3d?0:1] != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( trim_domain == c2_domain && pC->IsClosed() ) 
    {
      // (open 2d trims can still have vi0 = vi1 on closed surfaces)
      if ( vi0 != vi1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n",
                          vi0, vi1, trim.m_c2i );
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else if ( vi0 == vi1 )
    {
      // TODO: check that trim start/end is a closed surface seam point.
    }
    else
    {
      // vi0 != vi1
      // TODO: check that trim start/end is not a closed surface seam point.
    }
    int i;
    for ( i = 0; i < edge.m_ti.Count(); i++ ) 
    {
      if ( edge.m_ti[i] == trim_index )
      {
        trim_eti = i;
        break;
      }
    }

    if ( trim_eti < 0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n",
                        trim_index, trim.m_ei );
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }

    if ( edge.m_ti.Count() == 2 )
    {
      int other_ti = edge.m_ti[ (edge.m_ti[0]==trim_index)?1:0 ];
      if ( other_ti >= 0 && other_ti < m_T.Count() && other_ti != trim_index )
      {
        const ON_BrepTrim& other_trim = m_T[other_ti];
        if ( other_trim.m_li == trim.m_li )
        {
          if ( trim.m_type != ON_BrepTrim::seam )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
              text_log->PushIndent();
              text_log->Print("trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n",
                              trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }
    }
  }
  if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n", trim.m_li,m_L.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_ei >= 0 && trim_eti < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n",trim.m_ei);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }


  switch ( trim.m_type )
  {
  case ON_BrepTrim::unknown:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::boundary:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() > 1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::mated:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::seam:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      int other_ti = -1;
      for ( int eti = 0; eti < edge.m_ti.Count(); eti++ ) 
      {
        if ( trim_eti == eti )
          continue;
        int i = edge.m_ti[eti];
        if ( i == trim_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d] = m_ti[%d] = %d.\n",trim_eti,eti,trim_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        if ( i < 0 || i >= m_T.Count() )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d]=%d is not a valid m_T[] index.\n",eti,i);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        const ON_BrepTrim& other_trim = m_T[i];
        if ( other_trim.m_type == ON_BrepTrim::seam && other_trim.m_li == trim.m_li )
        {
          if ( other_ti < 0 )
            other_ti = i;
          else
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d,%d, or %d] trim is not valid.\n",trim_index,other_ti,i);
              text_log->PushIndent();
              text_log->Print("All three trims have m_type = seam m_ei=%d and m_li = %d.\n",trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }

      if ( other_ti < 0 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but its other trim is not in the loop.\n");
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }

      if ( loop.m_type != ON_BrepLoop::outer && edge.m_ti.Count() <= 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      // 31 Jan 2002 - The definition of a seam trim is a trim that is connected to
      //               an edge, is part of loop, and exactly one other trim in the
      //               same loop is connected to the same edge.  This can happen
      //               on the interior of a surface (like an annulus in a plane)
      //               and on non-manifold edges.
      //if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
      //     trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      //    text_log->PushIndent();
      //    text_log->Print("trim.m_type = seam but trim.m_iso != N/S/E/W_iso\n");
      //    text_log->PopIndent();
      //  }
      //  return ON_BrepIsNotValid();
      //}
    }
    break;
  case ON_BrepTrim::singular:
    // most requirements are checked above
    if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
         trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::crvonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::crvonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei < 0 || trim.m_ei >= m_E.Count() )
      {
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::ptonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::ptonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x != trim.m_pbox.m_max.x || trim.m_pbox.m_min.y != trim.m_pbox.m_max.y || trim.m_pbox.m_min.z != trim.m_pbox.m_max.z ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x == ON_UNSET_VALUE || trim.m_pbox.m_min.y == ON_UNSET_VALUE || trim.m_pbox.m_min.z != 0.0 ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
    }
    break;

  case ON_BrepTrim::slit:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  case ON_BrepTrim::trim_type_count:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  default:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  }

  if ( trim.m_tolerance[0] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[0] = %g (should be >= 0.0)\n",trim.m_tolerance[0]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( trim.m_tolerance[1] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[1] = %g (should be >= 0.0)\n",trim.m_tolerance[1]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !trim.m_pbox.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_pbox is not valid.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true;
}